

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

bool r_exec::equ(Context *context,uint16_t *index)

{
  byte bVar1;
  uint16_t uVar2;
  Atom local_70 [7];
  byte local_69;
  undefined1 local_68 [7];
  bool r;
  undefined1 local_58 [8];
  Context rhs;
  Context local_38;
  undefined1 local_28 [8];
  Context lhs;
  uint16_t *index_local;
  Context *context_local;
  
  lhs.implementation = (_Context *)index;
  Context::getChild(&local_38,(uint16_t)context);
  Context::operator*((Context *)local_28);
  Context::~Context(&local_38);
  Context::getChild((Context *)local_68,(uint16_t)context);
  Context::operator*((Context *)local_58);
  Context::~Context((Context *)local_68);
  local_69 = Context::operator==((Context *)local_28,(Context *)local_58);
  r_code::Atom::Boolean(SUB81(local_70,0));
  uVar2 = Context::setAtomicResult(context,local_70);
  *(uint16_t *)&(lhs.implementation)->_vptr__Context = uVar2;
  r_code::Atom::~Atom(local_70);
  bVar1 = local_69;
  Context::~Context((Context *)local_58);
  Context::~Context((Context *)local_28);
  return (bool)(bVar1 & 1);
}

Assistant:

bool equ(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);
    bool r = (lhs == rhs);
    index = context.setAtomicResult(Atom::Boolean(r));
    return r;
}